

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf_pyr_height_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_16bbfca::GFPyrHeightTest_EncodeAndVerifyPSNR_Test::TestBody
          (GFPyrHeightTest_EncodeAndVerifyPSNR_Test *this)

{
  EncoderTest *pEVar1;
  int iVar2;
  undefined8 *puVar3;
  bool bVar4;
  pointer *__ptr;
  SEARCH_METHODS *message;
  AssertHelper local_a8;
  AssertHelper local_a0;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x160,0x120,(this->super_GFPyrHeightTest).super_EncoderTest.cfg_.g_timebase.den,
             (this->super_GFPyrHeightTest).super_EncoderTest.cfg_.g_timebase.num,0,0x20);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01003b10;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      pEVar1 = &(this->super_GFPyrHeightTest).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar4 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar4 == false) {
      iVar2 = (this->super_GFPyrHeightTest).nframes_;
      local_a8.data_ = (AssertHelperData *)0x0;
      if (iVar2 != 0) {
        local_a8.data_ = (AssertHelperData *)((this->super_GFPyrHeightTest).psnr_ / (double)iVar2);
      }
      local_a0.data_ = (AssertHelperData *)(this->super_GFPyrHeightTest).psnr_threshold_;
      testing::internal::CmpHelperGT<double,double>
                ((internal *)&gtest_fatal_failure_checker,"GetAveragePsnr()","GetPsnrThreshold()",
                 (double *)&local_a8,(double *)&local_a0);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_a8.data_)->line,"GF Min Pyramid Height = ",0x18);
        std::ostream::operator<<
                  (&(local_a8.data_)->line,(this->super_GFPyrHeightTest).gf_min_pyr_height_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_a8.data_)->line,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_a8.data_)->line,"GF Max Pyramid Height = ",0x18);
        std::ostream::operator<<
                  (&(local_a8.data_)->line,(this->super_GFPyrHeightTest).gf_max_pyr_height_);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(SEARCH_METHODS **)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/gf_pyr_height_test.cc"
                   ,0x93,(char *)message);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_a8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_a8.data_ + 8))();
        }
      }
      puVar3 = (undefined8 *)
               CONCAT71(gtest_fatal_failure_checker._9_7_,
                        gtest_fatal_failure_checker.has_new_fatal_failure_);
      if (puVar3 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar3 != puVar3 + 2) {
          operator_delete((undefined8 *)*puVar3);
        }
        operator_delete(puVar3);
      }
      goto LAB_00639a94;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/gf_pyr_height_test.cc"
             ,0x92,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_00639a94:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(GFPyrHeightTest, EncodeAndVerifyPSNR) {
  libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                     cfg_.g_timebase.den, cfg_.g_timebase.num,
                                     0, 32);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  EXPECT_GT(GetAveragePsnr(), GetPsnrThreshold())
      << "GF Min Pyramid Height = " << gf_min_pyr_height_ << ", "
      << "GF Max Pyramid Height = " << gf_max_pyr_height_;
}